

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

BigInteger * __thiscall
Algorithms::pollardRho(BigInteger *__return_storage_ptr__,Algorithms *this,BigInteger *n)

{
  int iVar1;
  long x;
  bool bVar2;
  BigInteger b0;
  BigInteger local_170;
  BigInteger local_150;
  BigInteger b1;
  BigInteger local_110;
  BigInteger local_f0;
  BigInteger local_d0;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  BigIntegerLibrary::BigInteger::BigInteger(&local_50,0);
  BigIntegerLibrary::BigInteger::operator-(&local_90,n,1);
  random((Algorithms *)&b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
  BigIntegerLibrary::BigInteger::BigInteger(&b1,&b0);
  iVar1 = rand();
  BigIntegerLibrary::BigInteger::operator*(&local_110,&b1,&b1);
  x = (long)(iVar1 % 5 + 1);
  BigIntegerLibrary::BigInteger::operator+(&local_150,&local_110,x);
  BigIntegerLibrary::BigInteger::operator%(&local_170,&local_150,n);
  BigIntegerLibrary::BigInteger::operator=(&b1,&local_170);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
  BigIntegerLibrary::BigInteger::operator-(&local_170,&b1,&b0);
  BigIntegerLibrary::abs((BigIntegerLibrary *)&local_b0,(int)&local_170);
  BigIntegerLibrary::BigInteger::BigInteger(&local_d0,n);
  BigIntegerLibrary::gcd(__return_storage_ptr__,&local_b0,&local_d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
  iVar1 = 100000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_170,1);
    bVar2 = BigIntegerLibrary::BigInteger::operator==(__return_storage_ptr__,&local_170);
    if (bVar2) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
    }
    else {
      bVar2 = BigIntegerLibrary::BigInteger::operator==(__return_storage_ptr__,n);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
      if (!bVar2) break;
    }
    BigIntegerLibrary::BigInteger::operator*(&local_110,&b0,&b0);
    BigIntegerLibrary::BigInteger::operator+(&local_150,&local_110,x);
    BigIntegerLibrary::BigInteger::operator%(&local_170,&local_150,n);
    BigIntegerLibrary::BigInteger::operator=(&b0,&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
    BigIntegerLibrary::BigInteger::operator*(&local_110,&b1,&b1);
    BigIntegerLibrary::BigInteger::operator+(&local_150,&local_110,x);
    BigIntegerLibrary::BigInteger::operator%(&local_170,&local_150,n);
    BigIntegerLibrary::BigInteger::operator=(&b1,&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
    BigIntegerLibrary::BigInteger::operator*(&local_110,&b1,&b1);
    BigIntegerLibrary::BigInteger::operator+(&local_150,&local_110,x);
    BigIntegerLibrary::BigInteger::operator%(&local_170,&local_150,n);
    BigIntegerLibrary::BigInteger::operator=(&b1,&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
    BigIntegerLibrary::BigInteger::operator-(&local_150,&b1,&b0);
    BigIntegerLibrary::abs((BigIntegerLibrary *)&local_f0,(int)&local_150);
    BigIntegerLibrary::BigInteger::BigInteger(&local_70,n);
    BigIntegerLibrary::gcd(&local_170,&local_f0,&local_70);
    BigIntegerLibrary::BigInteger::operator=(__return_storage_ptr__,&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_f0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&b1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&b0);
  return __return_storage_ptr__;
}

Assistant:

BigInteger Algorithms::pollardRho(BigInteger n) {
    const int iterations_count = 1e5;
    BigInteger b0 = random(0, n - 1);
    BigInteger b1 = b0;
    int q = rand() % 5 + 1;
    b1 = (b1 * b1 + q) % n;
    BigInteger g = gcd(abs(b1 - b0), n);
    for (int i = 0; i < iterations_count && (g == 1 || g == n); ++i) {
        b0 = (b0 * b0 + q) % n;
        b1 = (b1 * b1 + q) % n;
        b1 = (b1 * b1 + q) % n;
        g = gcd(abs(b1 - b0), n);
    }
    return g;
}